

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_pixarlog.c
# Opt level: O0

int PixarLogDecode(TIFF *tif,uint8_t *op,tmsize_t occ,uint16_t s)

{
  uint8_t *puVar1;
  uint uVar2;
  int iVar3;
  char *local_90;
  char *local_80;
  uint16_t *puStack_60;
  int state;
  uint16_t *up;
  ulong uStack_50;
  int llen;
  tmsize_t nsamples;
  tmsize_t i;
  PixarLogState *sp;
  TIFFDirectory *td;
  uint16_t s_local;
  tmsize_t occ_local;
  uint8_t *op_local;
  TIFF *tif_local;
  
  puVar1 = tif->tif_data;
  uVar2 = *(uint *)(puVar1 + 0x108);
  uStack_50 = occ;
  if (1 < uVar2) {
    if (uVar2 - 2 < 3) {
      uStack_50 = (ulong)occ >> 1;
    }
    else {
      if (uVar2 != 5) {
        TIFFErrorExtR(tif,"PixarLogDecode","%u bit input not supported in PixarLog",
                      (ulong)(tif->tif_dir).td_bitspersample);
        return 0;
      }
      uStack_50 = (ulong)occ >> 2;
    }
  }
  uVar2 = (uint)*(ushort *)(puVar1 + 0x100) * (tif->tif_dir).td_imagewidth;
  if (puVar1 == (uint8_t *)0x0) {
    __assert_fail("sp != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_pixarlog.c"
                  ,0x364,"int PixarLogDecode(TIFF *, uint8_t *, tmsize_t, uint16_t)");
  }
  *(uint8_t **)(puVar1 + 0x80) = tif->tif_rawcp;
  *(int *)(puVar1 + 0x88) = (int)tif->tif_rawcc;
  *(undefined8 *)(puVar1 + 0x98) = *(undefined8 *)(puVar1 + 0xf8);
  *(int *)(puVar1 + 0xa0) = (int)(uStack_50 << 1);
  if ((ulong)*(uint *)(puVar1 + 0xa0) == uStack_50 * 2) {
    if (*(long *)(puVar1 + 0xf0) < (long)(ulong)*(uint *)(puVar1 + 0xa0)) {
      TIFFErrorExtR(tif,"PixarLogDecode","sp->stream.avail_out > sp->tbuf_size");
      tif_local._4_4_ = 0;
    }
    else {
      do {
        iVar3 = inflate((z_streamp)(puVar1 + 0x80),1);
        if (iVar3 == 1) break;
        if (iVar3 == -3) {
          if (*(long *)(puVar1 + 0xb0) == 0) {
            local_80 = "(null)";
          }
          else {
            local_80 = *(char **)(puVar1 + 0xb0);
          }
          TIFFErrorExtR(tif,"PixarLogDecode","Decoding error at scanline %u, %s",(ulong)tif->tif_row
                        ,local_80);
          return 0;
        }
        if (iVar3 != 0) {
          if (*(long *)(puVar1 + 0xb0) == 0) {
            local_90 = "(null)";
          }
          else {
            local_90 = *(char **)(puVar1 + 0xb0);
          }
          TIFFErrorExtR(tif,"PixarLogDecode","ZLib error: %s",local_90);
          return 0;
        }
      } while (*(int *)(puVar1 + 0xa0) != 0);
      if (*(int *)(puVar1 + 0xa0) == 0) {
        tif->tif_rawcp = *(uint8_t **)(puVar1 + 0x80);
        tif->tif_rawcc = (ulong)*(uint *)(puVar1 + 0x88);
        puStack_60 = *(uint16_t **)(puVar1 + 0xf8);
        if ((tif->tif_flags & 0x80) != 0) {
          TIFFSwabArrayOfShort(puStack_60,uStack_50);
        }
        if ((long)uStack_50 % (long)(int)uVar2 != 0) {
          TIFFWarningExtR(tif,"PixarLogDecode",
                          "stride %d is not a multiple of sample count, %ld, data truncated.",
                          (ulong)uVar2,uStack_50);
          uStack_50 = uStack_50 - (long)uStack_50 % (long)(int)uVar2;
        }
        occ_local = (tmsize_t)op;
        for (nsamples = 0; nsamples < (long)uStack_50; nsamples = (int)uVar2 + nsamples) {
          switch(*(undefined4 *)(puVar1 + 0x108)) {
          case 0:
            horizontalAccumulate8
                      (puStack_60,uVar2,(uint)*(ushort *)(puVar1 + 0x100),(uchar *)occ_local,
                       *(uchar **)(puVar1 + 0x130));
            occ_local = (int)uVar2 + occ_local;
            break;
          case 1:
            horizontalAccumulate8abgr
                      (puStack_60,uVar2,(uint)*(ushort *)(puVar1 + 0x100),(uchar *)occ_local,
                       *(uchar **)(puVar1 + 0x130));
            occ_local = (int)uVar2 + occ_local;
            break;
          case 2:
            horizontalAccumulate11
                      (puStack_60,uVar2,(uint)*(ushort *)(puVar1 + 0x100),(uint16_t *)occ_local);
            occ_local = (long)(int)uVar2 * 2 + occ_local;
            break;
          case 3:
            horizontalAccumulate12
                      (puStack_60,uVar2,(uint)*(ushort *)(puVar1 + 0x100),(int16_t *)occ_local,
                       *(float **)(puVar1 + 0x120));
            occ_local = (long)(int)uVar2 * 2 + occ_local;
            break;
          case 4:
            horizontalAccumulate16
                      (puStack_60,uVar2,(uint)*(ushort *)(puVar1 + 0x100),(uint16_t *)occ_local,
                       *(uint16_t **)(puVar1 + 0x128));
            occ_local = (long)(int)uVar2 * 2 + occ_local;
            break;
          case 5:
            horizontalAccumulateF
                      (puStack_60,uVar2,(uint)*(ushort *)(puVar1 + 0x100),(float *)occ_local,
                       *(float **)(puVar1 + 0x120));
            occ_local = (long)(int)uVar2 * 4 + occ_local;
            break;
          default:
            TIFFErrorExtR(tif,"PixarLogDecode","Unsupported bits/sample: %u",
                          (ulong)(tif->tif_dir).td_bitspersample);
            return 0;
          }
          puStack_60 = puStack_60 + (int)uVar2;
        }
        tif_local._4_4_ = 1;
      }
      else {
        TIFFErrorExtR(tif,"PixarLogDecode","Not enough data at scanline %u (short %u bytes)",
                      (ulong)tif->tif_row,(ulong)*(uint *)(puVar1 + 0xa0));
        tif_local._4_4_ = 0;
      }
    }
  }
  else {
    TIFFErrorExtR(tif,"PixarLogDecode","ZLib cannot deal with buffers this size");
    tif_local._4_4_ = 0;
  }
  return tif_local._4_4_;
}

Assistant:

static int PixarLogDecode(TIFF *tif, uint8_t *op, tmsize_t occ, uint16_t s)
{
    static const char module[] = "PixarLogDecode";
    TIFFDirectory *td = &tif->tif_dir;
    PixarLogState *sp = DecoderState(tif);
    tmsize_t i;
    tmsize_t nsamples;
    int llen;
    uint16_t *up;

    switch (sp->user_datafmt)
    {
        case PIXARLOGDATAFMT_FLOAT:
            nsamples = occ / sizeof(float); /* XXX float == 32 bits */
            break;
        case PIXARLOGDATAFMT_16BIT:
        case PIXARLOGDATAFMT_12BITPICIO:
        case PIXARLOGDATAFMT_11BITLOG:
            nsamples = occ / sizeof(uint16_t); /* XXX uint16_t == 16 bits */
            break;
        case PIXARLOGDATAFMT_8BIT:
        case PIXARLOGDATAFMT_8BITABGR:
            nsamples = occ;
            break;
        default:
            TIFFErrorExtR(tif, module,
                          "%" PRIu16 " bit input not supported in PixarLog",
                          td->td_bitspersample);
            return 0;
    }

    llen = sp->stride * td->td_imagewidth;

    (void)s;
    assert(sp != NULL);

    sp->stream.next_in = tif->tif_rawcp;
    sp->stream.avail_in = (uInt)tif->tif_rawcc;

    sp->stream.next_out = (unsigned char *)sp->tbuf;
    assert(sizeof(sp->stream.avail_out) == 4); /* if this assert gets raised,
         we need to simplify this code to reflect a ZLib that is likely updated
         to deal with 8byte memory sizes, though this code will respond
         appropriately even before we simplify it */
    sp->stream.avail_out = (uInt)(nsamples * sizeof(uint16_t));
    if (sp->stream.avail_out != nsamples * sizeof(uint16_t))
    {
        TIFFErrorExtR(tif, module, "ZLib cannot deal with buffers this size");
        return (0);
    }
    /* Check that we will not fill more than what was allocated */
    if ((tmsize_t)sp->stream.avail_out > sp->tbuf_size)
    {
        TIFFErrorExtR(tif, module, "sp->stream.avail_out > sp->tbuf_size");
        return (0);
    }
    do
    {
        int state = inflate(&sp->stream, Z_PARTIAL_FLUSH);
        if (state == Z_STREAM_END)
        {
            break; /* XXX */
        }
        if (state == Z_DATA_ERROR)
        {
            TIFFErrorExtR(
                tif, module, "Decoding error at scanline %" PRIu32 ", %s",
                tif->tif_row, sp->stream.msg ? sp->stream.msg : "(null)");
            return (0);
        }
        if (state != Z_OK)
        {
            TIFFErrorExtR(tif, module, "ZLib error: %s",
                          sp->stream.msg ? sp->stream.msg : "(null)");
            return (0);
        }
    } while (sp->stream.avail_out > 0);

    /* hopefully, we got all the bytes we needed */
    if (sp->stream.avail_out != 0)
    {
        TIFFErrorExtR(tif, module,
                      "Not enough data at scanline %" PRIu32
                      " (short %u bytes)",
                      tif->tif_row, sp->stream.avail_out);
        return (0);
    }

    tif->tif_rawcp = sp->stream.next_in;
    tif->tif_rawcc = sp->stream.avail_in;

    up = sp->tbuf;
    /* Swap bytes in the data if from a different endian machine. */
    if (tif->tif_flags & TIFF_SWAB)
        TIFFSwabArrayOfShort(up, nsamples);

    /*
     * if llen is not an exact multiple of nsamples, the decode operation
     * may overflow the output buffer, so truncate it enough to prevent
     * that but still salvage as much data as possible.
     */
    if (nsamples % llen)
    {
        TIFFWarningExtR(tif, module,
                        "stride %d is not a multiple of sample count, "
                        "%" TIFF_SSIZE_FORMAT ", data truncated.",
                        llen, nsamples);
        nsamples -= nsamples % llen;
    }

    for (i = 0; i < nsamples; i += llen, up += llen)
    {
        switch (sp->user_datafmt)
        {
            case PIXARLOGDATAFMT_FLOAT:
                horizontalAccumulateF(up, llen, sp->stride, (float *)op,
                                      sp->ToLinearF);
                op += llen * sizeof(float);
                break;
            case PIXARLOGDATAFMT_16BIT:
                horizontalAccumulate16(up, llen, sp->stride, (uint16_t *)op,
                                       sp->ToLinear16);
                op += llen * sizeof(uint16_t);
                break;
            case PIXARLOGDATAFMT_12BITPICIO:
                horizontalAccumulate12(up, llen, sp->stride, (int16_t *)op,
                                       sp->ToLinearF);
                op += llen * sizeof(int16_t);
                break;
            case PIXARLOGDATAFMT_11BITLOG:
                horizontalAccumulate11(up, llen, sp->stride, (uint16_t *)op);
                op += llen * sizeof(uint16_t);
                break;
            case PIXARLOGDATAFMT_8BIT:
                horizontalAccumulate8(up, llen, sp->stride, (unsigned char *)op,
                                      sp->ToLinear8);
                op += llen * sizeof(unsigned char);
                break;
            case PIXARLOGDATAFMT_8BITABGR:
                horizontalAccumulate8abgr(up, llen, sp->stride,
                                          (unsigned char *)op, sp->ToLinear8);
                op += llen * sizeof(unsigned char);
                break;
            default:
                TIFFErrorExtR(tif, module, "Unsupported bits/sample: %" PRIu16,
                              td->td_bitspersample);
                return (0);
        }
    }

    return (1);
}